

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::parse(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
        *this,item_event_visitor *visitor,error_code *ec)

{
  size_t *psVar1;
  pointer *pppVar2;
  pointer ppVar3;
  pointer ppVar4;
  byte *pbVar5;
  byte *pbVar6;
  assertion_error *this_00;
  ushort uVar7;
  string local_48;
  
  if (this->done_ == false) {
    do {
      if (this->more_ != true) {
        return;
      }
      ppVar3 = (this->state_stack_).
               super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar3[-1].mode) {
      case root:
        ppVar3[-1].mode = accept;
        goto LAB_002b02de;
      case accept:
        ppVar4 = (this->state_stack_).
                 super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)ppVar3 - (long)ppVar4 != 0x20) {
          this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                     "");
          assertion_error::assertion_error(this_00,&local_48);
          __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ppVar3 != ppVar4) {
          (this->state_stack_).
          super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        }
        this->more_ = false;
        this->done_ = true;
        (*visitor->_vptr_basic_item_event_visitor[2])(visitor);
        break;
      case array:
        if (ppVar3[-1].index < ppVar3[-1].length) {
          ppVar3[-1].index = ppVar3[-1].index + 1;
          goto LAB_002b02de;
        }
        end_array(this,visitor,ec);
        break;
      case indefinite_array:
        pbVar5 = (this->source_).current_._M_current;
        pbVar6 = (this->source_).end_._M_current;
        if (pbVar5 == pbVar6) {
          uVar7 = 0x100;
        }
        else {
          uVar7 = (ushort)*pbVar5;
        }
        if (uVar7 < 0x100) {
          if (uVar7 == 0xff) {
            if (pbVar5 != pbVar6) {
              psVar1 = &(this->source_).position_;
              *psVar1 = *psVar1 + 1;
              (this->source_).current_._M_current = pbVar5 + 1;
            }
            end_array(this,visitor,ec);
          }
          else {
LAB_002b02bb:
            read_item(this,visitor,ec);
          }
        }
        else {
LAB_002b02fc:
          std::error_code::operator=(ec,unexpected_eof);
          this->more_ = false;
        }
        goto LAB_002b02c9;
      case map_key:
        if (ppVar3[-1].index < ppVar3[-1].length) {
          ppVar3[-1].index = ppVar3[-1].index + 1;
          ppVar3[-1].mode = map_value;
          goto LAB_002b02de;
        }
        end_object(this,visitor,ec);
        break;
      case map_value:
        ppVar3[-1].mode = map_key;
        goto LAB_002b02de;
      case indefinite_map_key:
        pbVar5 = (this->source_).current_._M_current;
        pbVar6 = (this->source_).end_._M_current;
        if (pbVar5 == pbVar6) {
          uVar7 = 0x100;
        }
        else {
          uVar7 = (ushort)*pbVar5;
        }
        if (0xff < uVar7) goto LAB_002b02fc;
        if (uVar7 != 0xff) {
          ppVar3[-1].mode = indefinite_map_value;
          goto LAB_002b02bb;
        }
        if (pbVar5 != pbVar6) {
          psVar1 = &(this->source_).position_;
          *psVar1 = *psVar1 + 1;
          (this->source_).current_._M_current = pbVar5 + 1;
        }
        end_object(this,visitor,ec);
LAB_002b02c9:
        if (0xff < uVar7) {
          return;
        }
        break;
      case indefinite_map_value:
        ppVar3[-1].mode = indefinite_map_key;
LAB_002b02de:
        read_item(this,visitor,ec);
        break;
      case multi_dim:
        if (ppVar3[-1].index == 0) {
          ppVar3[-1].index = 1;
          goto LAB_002b02de;
        }
        (*visitor->_vptr_basic_item_event_visitor[0x1e])(visitor,this,ec);
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
        pppVar2 = &(this->state_stack_).
                   super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + -1;
      }
    } while (this->done_ != true);
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::multi_dim:
                {
                    if (state_stack_.back().index == 0)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        produce_end_multi_dim(visitor, ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                    }
                    else
                    {
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                    }
                    else
                    {
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }